

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O3

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::update(ExponentiallyDecayingReservoir *this,long value)

{
  atomic_long *paVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  random_device *__urng;
  mapped_type *this_00;
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  *this_01;
  double dVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  pVar7;
  double priority;
  double smallest_priority;
  _func_result_type_void_ptr *local_80;
  _func_result_type_void_ptr *local_78;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  pair<double,_cppmetrics::WeightedSample> local_58;
  WeightedSample local_40;
  
  rescale_if_needed(this);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  iVar4 = (*this->m_clock->_vptr_Clock[1])();
  local_68 = exp((double)(CONCAT44(extraout_var,iVar4) - this->m_start) * this->m_alpha);
  __urng = (random_device *)__tls_get_addr(&PTR_00120f10);
  if (__urng[1].field_0.field2[0x18] == '\0') {
    __urng[1].field_0.field2[0x18] = 1;
    __cxx_global_var_init();
    local_78 = (_func_result_type_void_ptr *)0x0;
    uStack_70 = 0x3ff0000000000000;
    __urng[1].field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
    *(undefined8 *)((long)&__urng[1].field_0 + 0x10) = 0x3ff0000000000000;
    if (__urng[1].field_0.field2[0x18] == '\0') {
      __urng[1].field_0.field2[0x18] = 1;
      __cxx_global_var_init();
      __urng[1].field_0.field_0._M_func = local_78;
      *(undefined8 *)((long)&__urng[1].field_0 + 0x10) = uStack_70;
    }
  }
  dVar5 = std::generate_canonical<double,53ul,std::random_device>(__urng);
  dVar2 = *(double *)((long)&__urng[1].field_0 + 8);
  local_80 = (_func_result_type_void_ptr *)
             (local_68 / (dVar5 * (*(double *)((long)&__urng[1].field_0 + 0x10) - dVar2) + dVar2));
  LOCK();
  paVar1 = &this->m_count;
  lVar3 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  if (this->m_size < lVar3 + 1U) {
    local_60 = *(double *)
                ((this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_78 = local_80;
    if (local_60 < (double)local_80) {
      WeightedSample::WeightedSample(&local_40,value,local_68);
      local_58.first = (double)local_78;
      WeightedSample::WeightedSample(&local_58.second,&local_40);
      this_01 = &this->m_samples;
      pVar6 = std::
              _Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
              ::_M_emplace_unique<std::pair<double,cppmetrics::WeightedSample>>
                        ((_Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                          *)this_01,&local_58);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pVar7 = std::
                _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                ::equal_range(&this_01->_M_t,&local_60);
        std::
        _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
        ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node
                      );
      }
    }
  }
  else {
    WeightedSample::WeightedSample((WeightedSample *)&local_58,value,local_68);
    this_00 = std::
              map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
              ::operator[](&this->m_samples,(key_type *)&local_80);
    WeightedSample::operator=(this_00,(WeightedSample *)&local_58);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::update(long value)
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  auto now = m_clock->now_as_time_t();
  auto scale_factor = now - m_start;
  double item_weight = std::exp(m_alpha * scale_factor);
  double priority = item_weight / dist(rd);
  
  auto new_size = m_count.fetch_add(1) + 1;
  if (new_size <= m_size)
  {
    m_samples[priority] = WeightedSample{value, item_weight};
  }
  else
  {
    const auto& smallest_pair = *m_samples.begin();
    double smallest_priority = smallest_pair.first;
    if (smallest_priority < priority)
    {
      auto insert_result = m_samples.insert(std::make_pair(priority, WeightedSample{value, item_weight}));
      bool did_insert = insert_result.second;
      if (did_insert)
      {
        m_samples.erase(smallest_priority);
      }
    }
  }
}